

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_schedule_async.c
# Opt level: O2

log_policy_interface log_policy_schedule_async_interface(void)

{
  return &log_policy_schedule_async_interface::policy_interface_schedule;
}

Assistant:

log_policy_interface log_policy_schedule_async_interface(void)
{
	static struct log_policy_schedule_impl_type log_policy_schedule_async_impl_obj = {
		&log_policy_schedule_async_lock,
		&log_policy_schedule_async_execute,
		&log_policy_schedule_async_unlock
	};

	static struct log_policy_interface_type policy_interface_schedule = {
		&log_policy_schedule_async_create,
		&log_policy_schedule_async_impl_obj,
		&log_policy_schedule_async_destroy
	};

	return &policy_interface_schedule;
}